

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrome_trace_converter.cpp
# Opt level: O0

ChromeTraceConverter * __thiscall
HawkTracer::client::ChromeTraceConverter::_get_args_abi_cxx11_
          (ChromeTraceConverter *this,Event *event)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  int iVar2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>_>
  *this_00;
  string *local_240;
  undefined1 local_1c0 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  _Self local_140;
  _Self local_138;
  reference local_130;
  value_type *value;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>_>
  *__range2;
  allocator local_108;
  allocator local_107;
  bool is_first;
  allocator local_105 [20];
  allocator local_f1;
  string *local_f0;
  string local_e8 [32];
  string local_c8 [32];
  string local_a8 [32];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  iterator local_28;
  size_type local_20;
  Event *local_18;
  Event *event_local;
  string *ret;
  
  local_18 = event;
  event_local = (Event *)this;
  if ((_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::
                                   core_fields_abi_cxx11_), iVar2 != 0)) {
    __range2._6_1_ = 1;
    local_f0 = local_e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"thread_id",&local_f1);
    local_f0 = local_c8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"timestamp",local_105);
    local_f0 = local_a8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"klass_id",(allocator *)&is_first);
    local_f0 = local_88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"id",&local_107);
    local_f0 = local_68;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"label",&local_108);
    local_f0 = local_48;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"duration",(allocator *)((long)&__range2 + 7));
    __range2._6_1_ = 0;
    local_28 = (iterator)local_e8;
    local_20 = 6;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&__range2 + 4));
    __l._M_len = local_20;
    __l._M_array = local_28;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          ((long)&__range2 + 5),
          (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&__range2 + 4));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&__range2 + 4));
    local_240 = (string *)&local_28;
    do {
      local_240 = local_240 + -0x20;
      std::__cxx11::string::~string(local_240);
    } while (local_240 != local_e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    std::allocator<char>::~allocator((allocator<char> *)&local_108);
    std::allocator<char>::~allocator((allocator<char> *)&local_107);
    std::allocator<char>::~allocator((allocator<char> *)&is_first);
    std::allocator<char>::~allocator((allocator<char> *)local_105);
    std::allocator<char>::~allocator((allocator<char> *)&local_f1);
    __cxa_atexit(std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::~set,&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::
                         core_fields_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::
                         core_fields_abi_cxx11_);
  }
  __range2._3_1_ = 0;
  std::__cxx11::string::string((string *)this);
  __range2._2_1_ = 1;
  this_00 = parser::Event::get_values_abi_cxx11_(local_18);
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>_>
           ::begin(this_00);
  value = (value_type *)
          std::
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>_>_>
          ::end(this_00);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_true>
                              *)&value), bVar1) {
    local_130 = std::__detail::
                _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_false,_true>
                ::operator*(&__end2);
    local_138._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_,
                &local_130->first);
    local_140._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&_get_args[abi:cxx11](HawkTracer::parser::Event_const&)::core_fields_abi_cxx11_);
    bVar1 = std::operator!=(&local_138,&local_140);
    if (!bVar1) {
      if ((__range2._2_1_ & 1) == 0) {
        std::__cxx11::string::operator+=((string *)this,",");
      }
      else {
        __range2._2_1_ = 0;
      }
      std::operator+(local_1c0 + 0x20,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x14947d);
      std::operator+(local_180,local_1c0 + 0x20);
      _get_json_value_abi_cxx11_((ChromeTraceConverter *)local_1c0,&local_130->second);
      std::operator+(local_160,local_180);
      std::__cxx11::string::operator+=((string *)this,(string *)local_160);
      std::__cxx11::string::~string((string *)local_160);
      std::__cxx11::string::~string((string *)local_1c0);
      std::__cxx11::string::~string((string *)local_180);
      std::__cxx11::string::~string((string *)(local_1c0 + 0x20));
    }
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_HawkTracer::parser::Event::Value>,_false,_true>
    ::operator++(&__end2);
  }
  return this;
}

Assistant:

std::string ChromeTraceConverter::_get_args(const parser::Event& event)
{
    static std::set<std::string> core_fields = {"thread_id", "timestamp", "klass_id", "id", "label", "duration"};

    std::string ret;
    bool is_first = true;

    for (const auto& value : event.get_values())
    {
        if (core_fields.find(value.first) != core_fields.end())
        {
            continue;
        }
        if (is_first)
        {
            is_first = false;
        }
        else
        {
            ret += ",";
        }
        ret += "\"" + value.first + "\": " + _get_json_value(value.second);
    }
    return ret;
}